

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::DeferredFailIfUnicode
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,HRESULT error)

{
  code *pcVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  ParseError *this_00;
  ulong uVar6;
  long lVar7;
  
  if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x23e,"(this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())",
                       "this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()");
    if (!bVar3) goto LAB_00ed50df;
    *puVar5 = 0;
  }
  if (this->deferredIfUnicodeError == (ParseError *)0x0) {
    this_00 = (ParseError *)new<Memory::ArenaAllocator>(0x10,this->ctAllocator,0x366bee);
    bVar3 = this->inBody;
    uVar6 = (long)this->next - (long)this->input;
    if (this->next < this->input || 0x7ffffffe < (long)uVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0x37,"(ph >= pl && ph - pl <= MaxCharCount)",
                         "ph >= pl && ph - pl <= MaxCharCount");
      if (!bVar4) goto LAB_00ed50df;
      *puVar5 = 0;
    }
    if ((uVar6 & 0xffffffff) < (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xb0,"(nextOffset >= this->m_cMultiUnits)",
                         "nextOffset >= this->m_cMultiUnits");
      if (!bVar4) goto LAB_00ed50df;
      *puVar5 = 0;
    }
    sVar2 = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
    lVar7 = (long)this->next - (long)this->input;
    if (this->next < this->input || 0x7ffffffe < lVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0x37,"(ph >= pl && ph - pl <= MaxCharCount)",
                         "ph >= pl && ph - pl <= MaxCharCount");
      if (!bVar4) {
LAB_00ed50df:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    ParseError::ParseError(this_00,bVar3,(int)uVar6 - (int)sVar2,(CharCount)lVar7,error);
    this->deferredIfUnicodeError = this_00;
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>::DeferredFailIfUnicode(HRESULT error)
    {
        Assert(this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());
        if (this->deferredIfUnicodeError == nullptr)
        {
            this->deferredIfUnicodeError = Anew(ctAllocator, ParseError, inBody, Pos(), Chars<EncodedChar>::OSB(next, input), error);
        }
    }